

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

void always_expect_(TestReporter *test_reporter,char *function,char *test_file,int test_line,...)

{
  char in_AL;
  _Bool _Var1;
  CgreenVector *constraints_00;
  RecordedExpectation *item;
  undefined8 in_R8;
  char *pcVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list constraints;
  __va_list_tag local_f8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b8 = in_R8;
  local_b0 = in_R9;
  _Var1 = have_always_expectation_for(function);
  if (_Var1) {
    pcVar2 = 
    "Mocked function [%s] already has an expectation and will always be called a certain way; any expectations declared after an always expectation are discarded"
    ;
  }
  else {
    _Var1 = have_never_call_expectation_for(function);
    if (!_Var1) {
      local_f8.reg_save_area = local_d8;
      local_f8.overflow_arg_area = &constraints[0].overflow_arg_area;
      local_f8.gp_offset = 0x20;
      local_f8.fp_offset = 0x30;
      constraints_00 = constraints_vector_from_va_list(&local_f8);
      item = create_recorded_expectation(function,test_file,test_line,constraints_00);
      item->time_to_live = 0xf314159;
      cgreen_vector_add(global_expectation_queue,item);
      return;
    }
    remove_never_call_expectation_for(function);
    pcVar2 = 
    "Mocked function [%s] already has an expectation that it will never be called; any expectations declared after a never call expectation are discarded"
    ;
  }
  (*test_reporter->assert_true)(test_reporter,test_file,test_line,0,pcVar2,function);
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &constraints[0].overflow_arg_area;
  local_f8.gp_offset = 0x20;
  local_f8.fp_offset = 0x30;
  destroy_constraints(&local_f8);
  return;
}

Assistant:

void always_expect_(TestReporter* test_reporter, const char *function, const char *test_file, int test_line, ...) {
    va_list constraints;
    RecordedExpectation *expectation;
    CgreenVector *constraints_vector;

    if (have_always_expectation_for(function)) {
        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation and will always be called a certain way; "
                "any expectations declared after an always expectation are discarded", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    if (have_never_call_expectation_for(function)) {
        remove_never_call_expectation_for(function);

        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will never be called; "
                "any expectations declared after a never call expectation are discarded", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    va_start(constraints, test_line);
    constraints_vector = constraints_vector_from_va_list(constraints);
    expectation = create_recorded_expectation(function, test_file, test_line, constraints_vector);
    va_end(constraints);
    expectation->time_to_live = UNLIMITED_TIME_TO_LIVE;
    cgreen_vector_add(global_expectation_queue, expectation);
}